

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqllogic_test_runner.cpp
# Opt level: O1

void __thiscall
duckdb::SQLLogicTestRunner::SQLLogicTestRunner(SQLLogicTestRunner *this,string *dbpath)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  char *pcVar3;
  undefined8 uVar4;
  unique_ptr<duckdb::DBConfig,_std::default_delete<duckdb::DBConfig>,_true> *this_00;
  DBConfig *pDVar5;
  DBConfig DVar6;
  pointer pDVar7;
  char *pcVar8;
  long lVar9;
  undefined1 local_aa;
  undefined1 local_a9 [16];
  undefined1 local_99;
  string *local_98;
  unique_ptr<duckdb::DBConfig,_std::default_delete<duckdb::DBConfig>,_true> *local_90;
  DBConfig *local_88 [2];
  DBConfig local_78 [16];
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  this->_vptr_SQLLogicTestRunner = (_func_int **)&PTR_LoadDatabase_005dbdc0;
  local_38 = &(this->dbpath).field_2;
  (this->dbpath)._M_dataplus._M_p = (pointer)local_38;
  pcVar2 = (dbpath->_M_dataplus)._M_p;
  paVar1 = &dbpath->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar1) {
    uVar4 = *(undefined8 *)((long)&dbpath->field_2 + 8);
    local_38->_M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->dbpath).field_2 + 8) = uVar4;
  }
  else {
    (this->dbpath)._M_dataplus._M_p = pcVar2;
    (this->dbpath).field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  (this->dbpath)._M_string_length = dbpath->_M_string_length;
  (dbpath->_M_dataplus)._M_p = (pointer)paVar1;
  dbpath->_M_string_length = 0;
  (dbpath->field_2)._M_local_buf[0] = '\0';
  local_90 = &this->config;
  (this->con).super_unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>_>._M_t.
  super___uniq_ptr_impl<duckdb::Connection,_std::default_delete<duckdb::Connection>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Connection_*,_std::default_delete<duckdb::Connection>_>.
  super__Head_base<0UL,_duckdb::Connection_*,_false>._M_head_impl = (Connection *)0x0;
  (this->config).super_unique_ptr<duckdb::DBConfig,_std::default_delete<duckdb::DBConfig>_>._M_t.
  super___uniq_ptr_impl<duckdb::DBConfig,_std::default_delete<duckdb::DBConfig>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::DBConfig_*,_std::default_delete<duckdb::DBConfig>_>.
  super__Head_base<0UL,_duckdb::DBConfig_*,_false>._M_head_impl = (DBConfig *)0x0;
  (this->loaded_databases).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->db).super_unique_ptr<duckdb::DuckDB,_std::default_delete<duckdb::DuckDB>_>._M_t.
  super___uniq_ptr_impl<duckdb::DuckDB,_std::default_delete<duckdb::DuckDB>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::DuckDB_*,_std::default_delete<duckdb::DuckDB>_>.
  super__Head_base<0UL,_duckdb::DuckDB_*,_false>._M_head_impl = (DuckDB *)0x0;
  (this->loaded_databases).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->loaded_databases).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->extensions)._M_h._M_buckets = &(this->extensions)._M_h._M_single_bucket;
  (this->extensions)._M_h._M_bucket_count = 1;
  (this->extensions)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->extensions)._M_h._M_element_count = 0;
  (this->extensions)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->extensions)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->extensions)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->named_connection_map)._M_h._M_buckets = &(this->named_connection_map)._M_h._M_single_bucket
  ;
  (this->named_connection_map)._M_h._M_bucket_count = 1;
  (this->named_connection_map)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->named_connection_map)._M_h._M_element_count = 0;
  (this->named_connection_map)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->named_connection_map)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->named_connection_map)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->output_hash_mode = false;
  this->output_result_mode = false;
  this->debug_mode = false;
  this->finished_processing_file = (__atomic_base<bool>)0x0;
  this->hash_threshold = 0;
  (this->active_loops).super_vector<duckdb::LoopCommand_*,_std::allocator<duckdb::LoopCommand_*>_>.
  super__Vector_base<duckdb::LoopCommand_*,_std::allocator<duckdb::LoopCommand_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->active_loops).super_vector<duckdb::LoopCommand_*,_std::allocator<duckdb::LoopCommand_*>_>.
  super__Vector_base<duckdb::LoopCommand_*,_std::allocator<duckdb::LoopCommand_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->active_loops).super_vector<duckdb::LoopCommand_*,_std::allocator<duckdb::LoopCommand_*>_>.
  super__Vector_base<duckdb::LoopCommand_*,_std::allocator<duckdb::LoopCommand_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->active_loops).
           super_vector<duckdb::LoopCommand_*,_std::allocator<duckdb::LoopCommand_*>_>.
           super__Vector_base<duckdb::LoopCommand_*,_std::allocator<duckdb::LoopCommand_*>_>._M_impl
           .super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined8 *)
   ((long)&(this->top_level_loop).
           super_unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>_>._M_t.
           super___uniq_ptr_impl<duckdb::Command,_std::default_delete<duckdb::Command>_>._M_t.
           super__Tuple_impl<0UL,_duckdb::Command_*,_std::default_delete<duckdb::Command>_>.
           super__Head_base<0UL,_duckdb::Command_*,_false> + 4) = 0;
  (this->environment_variables)._M_h._M_buckets =
       &(this->environment_variables)._M_h._M_single_bucket;
  (this->environment_variables)._M_h._M_bucket_count = 1;
  (this->environment_variables)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->environment_variables)._M_h._M_element_count = 0;
  (this->environment_variables)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->environment_variables)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->environment_variables)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_98 = &this->local_extension_repo;
  local_40 = &(this->local_extension_repo).field_2;
  (this->local_extension_repo)._M_dataplus._M_p = (pointer)local_40;
  (this->local_extension_repo)._M_string_length = 0;
  (this->local_extension_repo).field_2._M_local_buf[0] = '\0';
  local_88[0] = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"HTTP","");
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"Unable to connect","");
  local_48 = (_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)&this->ignore_error_messages;
  std::
  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::_Hashtable<std::__cxx11::string_const*>
            (local_48,local_88,&local_48,0,local_a9,&local_aa,&local_99);
  lVar9 = 0;
  do {
    if (local_58 + lVar9 != *(undefined1 **)((long)local_68 + lVar9)) {
      operator_delete(*(undefined1 **)((long)local_68 + lVar9));
    }
    lVar9 = lVar9 + -0x20;
  } while (lVar9 != -0x40);
  local_88[0] = local_78;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_88,"differs from original result!","");
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"INTERNAL","");
  std::
  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::_Hashtable<std::__cxx11::string_const*>
            ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)&this->always_fail_error_messages,local_88,&local_48,0,local_a9,&local_aa,&local_99)
  ;
  lVar9 = 0;
  do {
    if (local_58 + lVar9 != *(undefined1 **)((long)local_68 + lVar9)) {
      operator_delete(*(undefined1 **)((long)local_68 + lVar9));
    }
    lVar9 = lVar9 + -0x20;
  } while (lVar9 != -0x40);
  (this->hash_label_map)._M_h._M_buckets = &(this->hash_label_map)._M_h._M_single_bucket;
  (this->hash_label_map)._M_h._M_bucket_count = 1;
  (this->hash_label_map)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->hash_label_map)._M_h._M_element_count = 0;
  (this->hash_label_map)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->hash_label_map)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->hash_label_map)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->result_label_map)._M_h._M_buckets = &(this->result_label_map)._M_h._M_single_bucket;
  (this->result_label_map)._M_h._M_bucket_count = 1;
  (this->result_label_map)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->result_label_map)._M_h._M_element_count = 0;
  (this->result_label_map)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->result_label_map)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->result_label_map)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->log_lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->log_lock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->log_lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->log_lock).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0
  ;
  (this->log_lock).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0
  ;
  GetTestConfig();
  pDVar5 = local_88[0];
  this_00 = local_90;
  local_88[0] = (DBConfig *)0x0;
  std::__uniq_ptr_impl<duckdb::DBConfig,_std::default_delete<duckdb::DBConfig>_>::reset
            ((__uniq_ptr_impl<duckdb::DBConfig,_std::default_delete<duckdb::DBConfig>_> *)local_90,
             pDVar5);
  pDVar5 = local_88[0];
  if (local_88[0] != (DBConfig *)0x0) {
    duckdb::DBConfig::~DBConfig(local_88[0]);
    operator_delete(pDVar5);
  }
  pDVar7 = unique_ptr<duckdb::DBConfig,_std::default_delete<duckdb::DBConfig>,_true>::operator->
                     (this_00);
  pDVar7[0x172] = (DBConfig)0x1;
  pDVar7 = unique_ptr<duckdb::DBConfig,_std::default_delete<duckdb::DBConfig>,_true>::operator->
                     (this_00);
  pDVar7[0xe1] = (DBConfig)0x0;
  pcVar8 = getenv("LOCAL_EXTENSION_REPO");
  if (pcVar8 == (char *)0x0) {
    pDVar7 = unique_ptr<duckdb::DBConfig,_std::default_delete<duckdb::DBConfig>,_true>::operator->
                       (this_00);
  }
  else {
    pcVar3 = (char *)(this->local_extension_repo)._M_string_length;
    strlen(pcVar8);
    std::__cxx11::string::_M_replace((ulong)local_98,0,pcVar3,(ulong)pcVar8);
    pDVar7 = unique_ptr<duckdb::DBConfig,_std::default_delete<duckdb::DBConfig>,_true>::operator->
                       (this_00);
  }
  pDVar7[0xe2] = (DBConfig)(pcVar8 != (char *)0x0);
  pcVar8 = getenv("DUCKDB_DEBUG_VERIFY_VECTOR");
  if (pcVar8 != (char *)0x0) {
    DVar6 = (DBConfig)duckdb::EnumUtil::FromString<duckdb::DebugVectorVerification>(pcVar8);
    pDVar7 = unique_ptr<duckdb::DBConfig,_std::default_delete<duckdb::DBConfig>,_true>::operator->
                       (this_00);
    pDVar7[0x461] = DVar6;
  }
  return;
}

Assistant:

SQLLogicTestRunner::SQLLogicTestRunner(string dbpath) : dbpath(std::move(dbpath)), finished_processing_file(false) {
	config = GetTestConfig();
	config->options.allow_unredacted_secrets = true;
	config->options.load_extensions = false;

	auto env_var = std::getenv("LOCAL_EXTENSION_REPO");
	if (!env_var) {
		config->options.autoload_known_extensions = false;
	} else {
		local_extension_repo = env_var;
		config->options.autoload_known_extensions = true;
	}
	auto verify_vector = std::getenv("DUCKDB_DEBUG_VERIFY_VECTOR");
	if (verify_vector) {
		config->options.debug_verify_vector = EnumUtil::FromString<DebugVectorVerification>(verify_vector);
	}
}